

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::TreeEnsembleClassifier::ByteSizeLong(TreeEnsembleClassifier *this)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  
  if (this->treeensemble_ == (TreeEnsembleParameters *)0x0 ||
      this == (TreeEnsembleClassifier *)&_TreeEnsembleClassifier_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = TreeEnsembleParameters::ByteSizeLong(this->treeensemble_);
    uVar5 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  uVar5 = this->postevaluationtransform_;
  if (uVar5 != 0) {
    if ((int)uVar5 < 0) {
      uVar3 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar3 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar2 = sVar2 + uVar3;
  }
  if (this->_oneof_case_[0] == 0x65) {
    sVar4 = Int64Vector::ByteSizeLong((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[0] != 100) goto LAB_004cbb8c;
    sVar4 = StringVector::ByteSizeLong((this->ClassLabels_).stringclasslabels_);
  }
  uVar5 = (uint)sVar4 | 1;
  iVar1 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar2 = sVar2 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
LAB_004cbb8c:
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t TreeEnsembleClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleClassifier)
  size_t total_size = 0;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->has_treeensemble()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->treeensemble_);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}